

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking64.h
# Opt level: O3

void packforblock19_64(uint64_t base,uint64_t **pin,uint8_t **pw)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  uint64_t uVar18;
  uint64_t uVar19;
  uint64_t uVar20;
  uint64_t uVar21;
  uint64_t uVar22;
  uint64_t uVar23;
  uint64_t uVar24;
  uint64_t uVar25;
  ulong *puVar26;
  uint64_t uVar27;
  uint64_t uVar28;
  uint64_t uVar29;
  uint64_t uVar30;
  uint64_t uVar31;
  int iVar32;
  
  puVar1 = *pin;
  iVar32 = (int)base;
  uVar2 = puVar1[3];
  uVar3 = puVar1[4];
  uVar4 = puVar1[5];
  uVar5 = puVar1[6];
  uVar6 = puVar1[7];
  uVar7 = puVar1[8];
  uVar27 = puVar1[9];
  uVar8 = puVar1[10];
  uVar9 = puVar1[0xb];
  uVar28 = puVar1[0xc];
  uVar10 = puVar1[0xd];
  uVar11 = puVar1[0xe];
  uVar12 = puVar1[0xf];
  uVar13 = puVar1[0x10];
  uVar14 = puVar1[0x11];
  uVar15 = puVar1[0x12];
  uVar29 = puVar1[0x13];
  uVar16 = puVar1[0x14];
  uVar17 = puVar1[0x15];
  uVar30 = puVar1[0x16];
  uVar18 = puVar1[0x17];
  uVar19 = puVar1[0x18];
  uVar20 = puVar1[0x19];
  uVar21 = puVar1[0x1a];
  uVar22 = puVar1[0x1b];
  uVar23 = puVar1[0x1c];
  uVar31 = puVar1[0x1d];
  uVar24 = puVar1[0x1e];
  uVar25 = puVar1[0x1f];
  puVar26 = (ulong *)*pw;
  *puVar26 = uVar2 - base << 0x39 | (ulong)(uint)((int)puVar1[2] - iVar32) << 0x26 |
             (puVar1[1] - base) * 0x80000 | *puVar1 - base;
  puVar26[1] = uVar5 - base << 0x32 | (uVar4 - base) * 0x80000000 |
               (uVar3 - base) * 0x1000 | uVar2 - base >> 7;
  puVar26[2] = uVar8 - base << 0x3e |
               (ulong)(uint)((int)uVar27 - iVar32) << 0x2b | (uVar7 - base) * 0x1000000 |
               (uVar6 - base) * 0x20 | uVar5 - base >> 0xe;
  puVar26[3] = uVar10 - base << 0x37 | (ulong)(uint)((int)uVar28 - iVar32) << 0x24 |
               (uVar9 - base) * 0x20000 | uVar8 - base >> 2;
  puVar26[4] = uVar13 - base << 0x30 | (uVar12 - base) * 0x20000000 |
               (uVar11 - base) * 0x400 | uVar10 - base >> 9;
  puVar26[5] = uVar16 - base << 0x3c |
               (ulong)(uint)((int)uVar29 - iVar32) << 0x29 | (uVar15 - base) * 0x400000 |
               (uVar14 - base) * 8 | uVar13 - base >> 0x10;
  puVar26[6] = uVar18 - base << 0x35 | (ulong)(uint)((int)uVar30 - iVar32) << 0x22 |
               (uVar17 - base) * 0x8000 | uVar16 - base >> 4;
  puVar26[7] = uVar21 - base << 0x2e | (uVar20 - base) * 0x8000000 |
               (uVar19 - base) * 0x100 | uVar18 - base >> 0xb;
  puVar26[8] = uVar24 - base << 0x3a |
               (ulong)(uint)((int)uVar31 - iVar32) << 0x27 | (uVar23 - base) * 0x100000 |
               (uVar22 - base) * 2 | uVar21 - base >> 0x12;
  puVar26[9] = (uVar25 - base) * 0x2000 | uVar24 - base >> 6;
  *pin = puVar1 + 0x20;
  *pw = *pw + 0x4c;
  return;
}

Assistant:

static void packforblock19_64(const uint64_t base, const uint64_t ** pin, uint8_t ** pw) {
  uint64_t * pw64 = *(uint64_t **) pw;
  const uint64_t * in = *pin;
  /* we are going to touch  10 64-bit words */ 
  uint64_t w0;
  uint64_t w1;
  uint64_t w2;
  uint64_t w3;
  uint64_t w4;
  uint64_t w5;
  uint64_t w6;
  uint64_t w7;
  uint64_t w8;
  uint64_t w9;
  w0 = (in[0] - base);
  w0 |=  (in[1] - base) << 19;
  w0 |=  (in[2] - base) << 38;
  w0 |= (in[3] - base) << 57;
  w1 = (in[3] - base) >> 7;
  w1 |=  (in[4] - base) << 12;
  w1 |=  (in[5] - base) << 31;
  w1 |= (in[6] - base) << 50;
  w2 = (in[6] - base) >> 14;
  w2 |=  (in[7] - base) << 5;
  w2 |=  (in[8] - base) << 24;
  w2 |=  (in[9] - base) << 43;
  w2 |= (in[10] - base) << 62;
  w3 = (in[10] - base) >> 2;
  w3 |=  (in[11] - base) << 17;
  w3 |=  (in[12] - base) << 36;
  w3 |= (in[13] - base) << 55;
  w4 = (in[13] - base) >> 9;
  w4 |=  (in[14] - base) << 10;
  w4 |=  (in[15] - base) << 29;
  w4 |= (in[16] - base) << 48;
  w5 = (in[16] - base) >> 16;
  w5 |=  (in[17] - base) << 3;
  w5 |=  (in[18] - base) << 22;
  w5 |=  (in[19] - base) << 41;
  w5 |= (in[20] - base) << 60;
  w6 = (in[20] - base) >> 4;
  w6 |=  (in[21] - base) << 15;
  w6 |=  (in[22] - base) << 34;
  w6 |= (in[23] - base) << 53;
  w7 = (in[23] - base) >> 11;
  w7 |=  (in[24] - base) << 8;
  w7 |=  (in[25] - base) << 27;
  w7 |= (in[26] - base) << 46;
  w8 = (in[26] - base) >> 18;
  w8 |=  (in[27] - base) << 1;
  w8 |=  (in[28] - base) << 20;
  w8 |=  (in[29] - base) << 39;
  w8 |= (in[30] - base) << 58;
  w9 = (in[30] - base) >> 6;
  w9 |=  (in[31] - base) << 13;
  pw64[0] = w0;
  pw64[1] = w1;
  pw64[2] = w2;
  pw64[3] = w3;
  pw64[4] = w4;
  pw64[5] = w5;
  pw64[6] = w6;
  pw64[7] = w7;
  pw64[8] = w8;
  pw64[9] = w9;
  *pin += 32; /* we consumed 32 64-bit integers */ 
  *pw += 76; /* we used up 76 output bytes */ 
}